

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O2

N_Vector * N_VCloneVectorArray(int count,N_Vector w)

{
  SUNContext sunctx;
  SUNErrCode SVar1;
  N_Vector *vs;
  N_Vector p_Var2;
  ulong uVar3;
  ulong uVar4;
  
  sunctx = w->sunctx;
  vs = (N_Vector *)malloc((long)count * 8);
  uVar3 = 0;
  uVar4 = (ulong)(uint)count;
  if (count < 1) {
    uVar4 = uVar3;
  }
  while( true ) {
    if (uVar4 == uVar3) {
      return vs;
    }
    p_Var2 = N_VClone(w);
    vs[uVar3] = p_Var2;
    SVar1 = SUNContext_PeekLastError(sunctx);
    if (SVar1 < 0) break;
    uVar3 = uVar3 + 1;
  }
  N_VDestroyVectorArray(vs,(int)uVar3 + -1);
  return (N_Vector *)0x0;
}

Assistant:

N_Vector* N_VCloneVectorArray(int count, N_Vector w)
{
  SUNFunctionBegin(w->sunctx);
  int j;
  N_Vector* vs = NULL;

  SUNAssertNull(count > 0, SUN_ERR_ARG_OUTOFRANGE);

  vs = (N_Vector*)malloc(count * sizeof(N_Vector));
  SUNAssertNull(vs, SUN_ERR_MALLOC_FAIL);

  for (j = 0; j < count; j++)
  {
    vs[j] = N_VClone(w);
    SUNCheckLastErrNoRet();
    if (SUNContext_PeekLastError(SUNCTX_) < 0)
    {
      N_VDestroyVectorArray(vs, j - 1);
      return (NULL);
    }
  }

  return (vs);
}